

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizer.cpp
# Opt level: O0

Action __thiscall
psy::C::TypeCanonicalizer::visitDeclarator_COMMON(TypeCanonicalizer *this,DeclaratorSyntax *node)

{
  DeclarationCategory DVar1;
  SymbolKind SVar2;
  int iVar3;
  Symbol *this_00;
  ostream *poVar4;
  undefined4 extraout_var;
  Type *pTVar5;
  Scope *pSVar6;
  MIXIN_TypeableDeclarationSymbol *pMVar7;
  undefined4 extraout_var_00;
  Type *canonTy_1;
  Type *ty;
  MIXIN_TypeableDeclarationSymbol *typeableDecl;
  Type *canonTy;
  TypedefDeclarationSymbol *tydefDecl;
  DeclarationSymbol *decl;
  DeclaratorSyntax *node_local;
  TypeCanonicalizer *this_local;
  
  this_00 = &SemanticModel::declarationBy(this->semaModel_,node)->super_Symbol;
  if (this_00 == (Symbol *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x78);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"<empty message>");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = Quit;
  }
  else {
    DVar1 = DeclarationSymbol::category((DeclarationSymbol *)this_00);
    if (DVar1 < Type) {
      pMVar7 = MIXIN_TypeableDeclarationSymbol::from((DeclarationSymbol *)this_00);
      if (pMVar7 == (MIXIN_TypeableDeclarationSymbol *)0x0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x85);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,"<empty message>");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        return Quit;
      }
      iVar3 = (*pMVar7->_vptr_MIXIN_TypeableDeclarationSymbol[2])();
      pSVar6 = DeclarationSymbol::enclosingScope((DeclarationSymbol *)this_00);
      pTVar5 = canonicalize(this,(Type *)CONCAT44(extraout_var_00,iVar3),pSVar6);
      (*pMVar7->_vptr_MIXIN_TypeableDeclarationSymbol[3])(pMVar7,pTVar5);
    }
    else if (DVar1 == Type) {
      SVar2 = Symbol::kind(this_00);
      if (SVar2 != TypedefDeclaration) {
        poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7b);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,"<empty message>");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        return Quit;
      }
      iVar3 = (*this_00->_vptr_Symbol[0x22])();
      pTVar5 = TypedefDeclarationSymbol::synonymizedType
                         ((TypedefDeclarationSymbol *)CONCAT44(extraout_var,iVar3));
      pSVar6 = DeclarationSymbol::enclosingScope((DeclarationSymbol *)this_00);
      pTVar5 = canonicalize(this,pTVar5,pSVar6);
      TypedefDeclarationSymbol::setSynonymizedType
                ((TypedefDeclarationSymbol *)CONCAT44(extraout_var,iVar3),pTVar5);
    }
    this_local._7_1_ = Skip;
  }
  return this_local._7_1_;
}

Assistant:

SyntaxVisitor::Action TypeCanonicalizer::visitDeclarator_COMMON(const DeclaratorSyntax* node)
{
    auto decl = semaModel_->declarationBy(node);
    PSY_ASSERT_2(decl, return Action::Quit);
    switch (decl->category()) {
        case DeclarationCategory::Type: {
            PSY_ASSERT_2(decl->kind() == SymbolKind::TypedefDeclaration, return Action::Quit);
            auto tydefDecl = decl->asTypedefDeclaration();
            auto canonTy = canonicalize(tydefDecl->synonymizedType(), decl->enclosingScope());
            tydefDecl->setSynonymizedType(canonTy);
            break;
        }
        case DeclarationCategory::Member:
        case DeclarationCategory::Function:
        case DeclarationCategory::Object: {
            auto typeableDecl = MIXIN_TypeableDeclarationSymbol::from(decl);
            PSY_ASSERT_2(typeableDecl, return Action::Quit);
            auto ty = typeableDecl->type();
            auto canonTy = canonicalize(ty, decl->enclosingScope());
            typeableDecl->setType(canonTy);
            break;
        }
    }

    return Action::Skip;
}